

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.cpp
# Opt level: O3

void DeclareEffect(UnityAudioEffectDefinition *definition,char *name,
                  UnityAudioEffect_CreateCallback createcallback,
                  UnityAudioEffect_ReleaseCallback releasecallback,
                  UnityAudioEffect_ProcessCallback processcallback,
                  UnityAudioEffect_SetFloatParameterCallback setfloatparametercallback,
                  UnityAudioEffect_GetFloatParameterCallback getfloatparametercallback,
                  UnityAudioEffect_GetFloatBufferCallback getfloatbuffercallback,
                  InternalEffectDefinitionRegistrationCallback registereffectdefcallback)

{
  memset(definition,0,0x88);
  strcpy(definition->name,name);
  definition->structsize = 0x88;
  definition->paramstructsize = 0x40;
  definition->apiversion = 0x10402;
  definition->pluginversion = 0x10000;
  definition->create = createcallback;
  definition->release = releasecallback;
  definition->process = processcallback;
  definition->setfloatparameter = setfloatparametercallback;
  definition->getfloatparameter = getfloatparametercallback;
  definition->getfloatbuffer = getfloatbuffercallback;
  (*registereffectdefcallback)(definition);
  return;
}

Assistant:

void DeclareEffect(
    UnityAudioEffectDefinition& definition,
    const char* name,
    UnityAudioEffect_CreateCallback createcallback,
    UnityAudioEffect_ReleaseCallback releasecallback,
    UnityAudioEffect_ProcessCallback processcallback,
    UnityAudioEffect_SetFloatParameterCallback setfloatparametercallback,
    UnityAudioEffect_GetFloatParameterCallback getfloatparametercallback,
    UnityAudioEffect_GetFloatBufferCallback getfloatbuffercallback,
    InternalEffectDefinitionRegistrationCallback registereffectdefcallback
    )
{
    memset(&definition, 0, sizeof(definition));
    strcpy_s(definition.name, name);
    definition.structsize = sizeof(UnityAudioEffectDefinition);
    definition.paramstructsize = sizeof(UnityAudioParameterDefinition);
    definition.apiversion = UNITY_AUDIO_PLUGIN_API_VERSION;
    definition.pluginversion = 0x010000;
    definition.create = createcallback;
    definition.release = releasecallback;
    definition.process = processcallback;
    definition.setfloatparameter = setfloatparametercallback;
    definition.getfloatparameter = getfloatparametercallback;
    definition.getfloatbuffer = getfloatbuffercallback;
    registereffectdefcallback(definition);
}